

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

Request * jaegertracing::net::http::Request::parse(Request *__return_storage_ptr__,istream *in)

{
  byte bVar1;
  bool bVar2;
  Method MVar3;
  istream *piVar4;
  size_type sVar5;
  ParseError *__return_storage_ptr___00;
  const_reference pvVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_151;
  undefined1 local_150 [12];
  undefined1 local_140 [12];
  string local_130 [32];
  string_type local_110;
  string_type local_f0;
  string_type local_d0;
  undefined1 local_ab;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  undefined1 local_78 [8];
  smatch match;
  string line;
  regex requestLinePattern;
  istream *in_local;
  Request *request;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&line.field_2 + 8),
             "([A-Z]+) ([^ ]+) HTTP/([0-9]\\.[0-9])$",0x10);
  std::__cxx11::string::string((string *)&match._M_begin);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_78);
  piVar4 = readLineCRLF(in,(string *)&match._M_begin);
  bVar1 = std::ios::operator!((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
  if ((((bVar1 & 1) == 0) &&
      (bVar2 = std::
               regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &match._M_begin,
                          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                          ((long)&line.field_2 + 8),0), bVar2)) &&
     (sVar5 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78), 3 < sVar5)) {
    local_ab = 0;
    Request(__return_storage_ptr__);
    pvVar6 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,1);
    std::__cxx11::sub_match::operator_cast_to_string(&local_d0,(sub_match *)pvVar6);
    MVar3 = parseMethod(&local_d0);
    __return_storage_ptr__->_method = MVar3;
    std::__cxx11::string::~string((string *)&local_d0);
    pvVar6 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,2);
    std::__cxx11::sub_match::operator_cast_to_string(&local_f0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_target,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    pvVar6 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_78,3);
    std::__cxx11::sub_match::operator_cast_to_string(&local_110,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->_version,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    readHeaders(in,&__return_storage_ptr__->_headers);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_140,in);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_150);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_140._0_8_;
    __beg._M_c = local_140._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_150._0_8_;
    __end._M_c = local_150._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (local_130,__beg,__end,&local_151);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_body,local_130);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_151);
    local_ab = 1;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78);
    std::__cxx11::string::~string((string *)&match._M_begin);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&line.field_2 + 8));
    return __return_storage_ptr__;
  }
  local_aa = 1;
  __return_storage_ptr___00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"request line",&local_a9);
  ParseError::make(__return_storage_ptr___00,&local_a8,(string *)&match._M_begin);
  local_aa = 0;
  __cxa_throw(__return_storage_ptr___00,&ParseError::typeinfo,ParseError::~ParseError);
}

Assistant:

Request Request::parse(std::istream& in)
{
    const std::regex requestLinePattern(
        "([A-Z]+) ([^ ]+) HTTP/([0-9]\\.[0-9])$");
    std::string line;
    std::smatch match;
    if (!readLineCRLF(in, line) ||
        !std::regex_match(line, match, requestLinePattern) ||
        match.size() < 4) {
        throw ParseError::make("request line", line);
    }
    Request request;

    request._method = parseMethod(match[1]);
    request._target = match[2];
    request._version = match[3];

    readHeaders(in, request._headers);
    request._body = std::string(std::istreambuf_iterator<char>(in),
                                std::istreambuf_iterator<char>{});

    return request;
}